

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall FTypeTable::AddType(FTypeTable *this,PType *type)

{
  PClass *p1;
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  PType *pPVar3;
  uint uVar4;
  intptr_t parm2;
  intptr_t parm1;
  intptr_t local_40;
  intptr_t local_38;
  
  if ((type->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
    iVar1 = (**(type->super_PTypeBase).super_DObject._vptr_DObject)(type);
    (type->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar1);
  }
  p1 = *(PClass **)
        &(type->super_PTypeBase).super_DObject.Class[1].super_PNativeStruct.super_PStruct.
         super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase.super_DObject;
  (*(type->super_PTypeBase).super_DObject._vptr_DObject[0x14])(type,&local_38,&local_40);
  sVar2 = Hash(p1,local_38,local_40);
  pPVar3 = FindType(this,p1,local_38,local_40,(size_t *)0x0);
  if (pPVar3 == (PType *)0x0) {
    uVar4 = (int)sVar2 + (int)(sVar2 / 0x3fd) * -0x3fd;
    type->HashNext = this->TypeHash[uVar4];
    this->TypeHash[uVar4] = type;
    if ((GC::State == 1) && (((type->super_PTypeBase).super_DObject.ObjectFlags & 3) != 0)) {
      GC::Barrier((DObject *)0x0,(DObject *)type);
    }
    return;
  }
  __assert_fail("FindType(metatype, parm1, parm2, NULL) == NULL && \"Type must not be inserted more than once\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                ,0xe3e,"void FTypeTable::AddType(PType *)");
}

Assistant:

void FTypeTable::AddType(PType *type)
{
	PClass *metatype;
	intptr_t parm1, parm2;
	size_t bucket;

	metatype = type->GetClass()->TypeTableType;
	type->GetTypeIDs(parm1, parm2);
	bucket = Hash(metatype, parm1, parm2) % HASH_SIZE;
	assert(FindType(metatype, parm1, parm2, NULL) == NULL && "Type must not be inserted more than once");

	type->HashNext = TypeHash[bucket];
	TypeHash[bucket] = type;
	GC::WriteBarrier(type);
}